

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

s32 __thiscall
irr::gui::CGUITabControl::insertTab
          (CGUITabControl *this,s32 idx,IGUITab *tab,bool serializationMode)

{
  u32 uVar1;
  int iVar2;
  IGUIElement *pIVar3;
  IGUITab **ppIVar4;
  byte in_CL;
  IGUIElement *in_RDX;
  u32 in_ESI;
  IGUIElement *in_RDI;
  IGUITab **in_stack_ffffffffffffffb8;
  u32 in_stack_ffffffffffffffc0;
  s32 idx_00;
  CGUITabControl *in_stack_ffffffffffffffd0;
  IGUIElement *pIVar5;
  undefined4 in_stack_ffffffffffffffe8;
  u32 local_4;
  
  if (in_RDX == (IGUIElement *)0x0) {
    local_4 = 0xffffffff;
  }
  else {
    local_4 = in_ESI;
    pIVar5 = in_RDI;
    uVar1 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3cfba2);
    if (((int)uVar1 < (int)in_ESI) && ((in_CL & 1) == 0)) {
      local_4 = 0xffffffff;
    }
    else {
      iVar2 = (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x2c])(in_RDI,in_RDX);
      if (iVar2 < 0) {
        if ((int)local_4 < 0) {
          local_4 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3cfbfd);
        }
        pIVar3 = IGUIElement::getParent(in_RDX);
        if (pIVar3 != in_RDI) {
          IGUIElement::addChildToEnd
                    (pIVar5,(IGUIElement *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
        }
        (*(((IGUIElement *)&in_RDX->super_IEventReceiver)->super_IEventReceiver).
          _vptr_IEventReceiver[0xf])(in_RDX,0);
        IReferenceCounted::grab
                  ((IReferenceCounted *)
                   ((((IGUIElement *)&in_RDX->super_IEventReceiver)->super_IEventReceiver).
                    _vptr_IEventReceiver[-3] +
                   (long)&(((IGUIElement *)&in_RDX->super_IEventReceiver)->super_IEventReceiver).
                          _vptr_IEventReceiver));
        if ((in_CL & 1) == 0) {
          core::array<irr::gui::IGUITab_*>::insert
                    ((array<irr::gui::IGUITab_*> *)pIVar5,
                     (IGUITab **)CONCAT44(local_4,in_stack_ffffffffffffffe8),
                     (u32)((ulong)in_RDX >> 0x20));
          idx_00 = (s32)((ulong)in_RDI >> 0x20);
          if (*(int *)&in_RDI[1].Children.
                       super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                       ._M_impl._M_node.super__List_node_base._M_next == -1) {
            *(u32 *)&in_RDI[1].Children.
                     super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                     ._M_impl._M_node.super__List_node_base._M_next = local_4;
            setVisibleTab(in_stack_ffffffffffffffd0,idx_00);
          }
          else if ((int)local_4 <=
                   *(int *)&in_RDI[1].Children.
                            super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                            ._M_impl._M_node.super__List_node_base._M_next) {
            *(int *)&in_RDI[1].Children.
                     super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                     ._M_impl._M_node.super__List_node_base._M_next =
                 *(int *)&in_RDI[1].Children.
                          super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                          ._M_impl._M_node.super__List_node_base._M_next + 1;
            setVisibleTab(in_stack_ffffffffffffffd0,idx_00);
          }
        }
        else {
          while (in_stack_ffffffffffffffc0 = local_4, local_4 = in_stack_ffffffffffffffc0,
                uVar1 = core::array<irr::gui::IGUITab_*>::size
                                  ((array<irr::gui::IGUITab_*> *)0x3cfc68),
                (int)uVar1 <= (int)in_stack_ffffffffffffffc0) {
            in_stack_ffffffffffffffd0 = (CGUITabControl *)0x0;
            core::array<irr::gui::IGUITab_*>::push_back
                      ((array<irr::gui::IGUITab_*> *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
          }
          pIVar5 = in_RDX;
          ppIVar4 = core::array<irr::gui::IGUITab_*>::operator[]
                              ((array<irr::gui::IGUITab_*> *)
                               CONCAT44(in_ESI,in_stack_ffffffffffffffc0),
                               (u32)((ulong)in_RDX >> 0x20));
          *ppIVar4 = (IGUITab *)in_RDX;
          if (local_4 ==
              *(u32 *)&in_RDI[1].Children.
                       super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                       ._M_impl._M_node.super__List_node_base._M_next) {
            setVisibleTab(in_stack_ffffffffffffffd0,(s32)((ulong)in_RDI >> 0x20));
            (*(((IGUIElement *)&pIVar5->super_IEventReceiver)->super_IEventReceiver).
              _vptr_IEventReceiver[0xf])(pIVar5,1);
          }
        }
        recalculateScrollBar((CGUITabControl *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
      }
      else {
        local_4 = 0xffffffff;
      }
    }
  }
  return local_4;
}

Assistant:

s32 CGUITabControl::insertTab(s32 idx, IGUITab *tab, bool serializationMode)
{
	if (!tab)
		return -1;
	if (idx > (s32)Tabs.size() && !serializationMode) // idx == Tabs.size() is indeed OK here as core::array can handle that
		return -1;
	// Not allowing to add same tab twice as it would make things complicated (serialization or setting active visible)
	if (getTabIndex(tab) >= 0)
		return -1;

	if (idx < 0)
		idx = (s32)Tabs.size();

	if (tab->getParent() != this)
		this->addChildToEnd(tab);

	tab->setVisible(false);

	tab->grab();

	if (serializationMode) {
		while (idx >= (s32)Tabs.size()) {
			Tabs.push_back(0);
		}
		Tabs[idx] = tab;

		if (idx == ActiveTabIndex) { // in serialization that can happen for any index
			setVisibleTab(ActiveTabIndex);
			tab->setVisible(true);
		}
	} else {
		Tabs.insert(tab, (u32)idx);

		if (ActiveTabIndex == -1) {
			ActiveTabIndex = idx;
			setVisibleTab(ActiveTabIndex);
		} else if (idx <= ActiveTabIndex) {
			++ActiveTabIndex;
			setVisibleTab(ActiveTabIndex);
		}
	}

	recalculateScrollBar();

	return idx;
}